

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_3d.hpp
# Opt level: O1

cartesian_cubic<float> *
sisl::io::read_raw_file<float>
          (int *rx,int *ry,int *rz,string *file,e_datatype *type,bool *swap_endian)

{
  undefined4 uVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  void *pvVar10;
  cartesian_cubic<float> *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ifstream fp;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in|_S_bin|_S_ate);
  if ((*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) &&
     (cVar7 = std::__basic_file<char>::is_open(), cVar7 != '\0')) {
    uVar9 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    uVar15 = 0xffffffffffffffff;
    if (-1 < (long)uVar9) {
      uVar15 = uVar9;
    }
    pvVar10 = operator_new__(uVar15);
    std::istream::read((char *)local_238,(long)pvVar10);
    this = (cartesian_cubic<float> *)operator_new(0x68);
    cartesian_cubic<float>::cartesian_cubic(this,*rx - 1,*ry - 1,*rz - 1);
    switch(*type) {
    case SDT_UINT8:
      if (0 < *rx) {
        uVar14 = 0;
        do {
          if (0 < *ry) {
            uVar15 = 0;
            do {
              if (0 < *rz) {
                uVar9 = 0;
                do {
                  bVar3 = *(byte *)((long)pvVar10 +
                                   (long)(int)((*ry * (int)uVar9 + (int)uVar15) * *rx + uVar14));
                  iVar8 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar14,uVar15,uVar9);
                  *(float *)CONCAT44(extraout_var,iVar8) = (float)bVar3;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while ((int)uVar13 < *rz);
              }
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
            } while ((int)uVar13 < *ry);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < *rx);
      }
      break;
    case SDT_UINT16:
      if (0 < *rx) {
        uVar14 = 0;
        do {
          if (0 < *ry) {
            uVar15 = 0;
            do {
              if (0 < *rz) {
                uVar9 = 0;
                do {
                  uVar5 = *(ushort *)
                           ((long)pvVar10 +
                           (long)(int)((*ry * (int)uVar9 + (int)uVar15) * *rx + uVar14) * 2);
                  bVar4 = *swap_endian;
                  iVar8 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar14,uVar15,uVar9);
                  uVar12 = uVar5 << 8 | uVar5 >> 8;
                  if (bVar4 == false) {
                    uVar12 = uVar5;
                  }
                  *(float *)CONCAT44(extraout_var_03,iVar8) = (float)uVar12;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while ((int)uVar13 < *rz);
              }
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
            } while ((int)uVar13 < *ry);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < *rx);
      }
      break;
    case SDT_UINT32:
      if (0 < *rx) {
        uVar14 = 0;
        do {
          if (0 < *ry) {
            uVar15 = 0;
            do {
              if (0 < *rz) {
                uVar9 = 0;
                do {
                  uVar13 = *(uint *)((long)pvVar10 +
                                    (long)(int)((*ry * (int)uVar9 + (int)uVar15) * *rx + uVar14) * 4
                                    );
                  bVar4 = *swap_endian;
                  iVar8 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar14,uVar15,uVar9);
                  uVar6 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                          uVar13 << 0x18;
                  if (bVar4 == false) {
                    uVar6 = uVar13;
                  }
                  *(float *)CONCAT44(extraout_var_01,iVar8) = (float)uVar6;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while ((int)uVar13 < *rz);
              }
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
            } while ((int)uVar13 < *ry);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < *rx);
      }
      break;
    case SDT_FLOAT:
      if (0 < *rx) {
        uVar14 = 0;
        do {
          if (0 < *ry) {
            uVar15 = 0;
            do {
              if (0 < *rz) {
                uVar9 = 0;
                do {
                  uVar1 = *(undefined4 *)
                           ((long)pvVar10 +
                           (long)(int)((*ry * (int)uVar9 + (int)uVar15) * *rx + uVar14) * 4);
                  iVar8 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar14,uVar15,uVar9);
                  *(undefined4 *)CONCAT44(extraout_var_02,iVar8) = uVar1;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while ((int)uVar13 < *rz);
              }
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
            } while ((int)uVar13 < *ry);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < *rx);
      }
      break;
    case SDT_DOUBLE:
      if (0 < *rx) {
        uVar14 = 0;
        do {
          if (0 < *ry) {
            uVar15 = 0;
            do {
              if (0 < *rz) {
                uVar9 = 0;
                do {
                  dVar2 = *(double *)
                           ((long)pvVar10 +
                           (long)(int)((*ry * (int)uVar9 + (int)uVar15) * *rx + uVar14) * 8);
                  iVar8 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                                    (this,(ulong)uVar14,uVar15,uVar9);
                  *(float *)CONCAT44(extraout_var_00,iVar8) = (float)dVar2;
                  uVar13 = (int)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while ((int)uVar13 < *rz);
              }
              uVar13 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar13;
            } while ((int)uVar13 < *ry);
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < *rx);
      }
      break;
    default:
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = "Unknown datatype passed to sisl::io::read_raw_file()!";
      __cxa_throw(puVar11,&char_const*::typeinfo,0);
    }
    operator_delete__(pvVar10);
  }
  else {
    this = (cartesian_cubic<float> *)0x0;
  }
  std::ifstream::~ifstream(local_238);
  return this;
}

Assistant:

inline cartesian_cubic<O>
       *read_raw_file(const int &rx, const int &ry, const int &rz,
                      const std::string &file, 
                      const e_datatype &type,
                      const bool &swap_endian = false) {
    using namespace std;

    // Define this to help indexing the raw data
    #define INDEX(i,j,k)  i + rx * ( j + ry*k )

    // Open the file
    ifstream fp(file.c_str(), ios::in | ios::binary | ios::ate);
    streampos size;

    if (!fp.good() || !fp.is_open()) return nullptr;
    size = fp.tellg();
    fp.seekg(0, ios::beg);

    // Allocate and Read
    char *buffer = new char[size];
    fp.read(buffer, size);

    // Allocate the array
    cartesian_cubic<O> *lattice = new cartesian_cubic<O>(rx-1, ry-1, rz-1);

    switch (type) {
        case SDT_UINT8:
        {
            unsigned char *l_buff = (unsigned char *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_UINT16:
        {
            unsigned short *l_buff = (unsigned short *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint16_t data = l_buff[INDEX(i,j,k)];

                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_16(data) : data); 
                    }
            break;
        }
        case SDT_UINT32:
        {
            unsigned int *l_buff = (unsigned int *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint32_t data = l_buff[INDEX(i,j,k)];
                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_32(data) : data); 
                    }
            break;
        }
        case SDT_FLOAT:
        {
            float *l_buff = (float *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_DOUBLE:
        {
            double *l_buff = (double *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        default:
            throw "Unknown datatype passed to sisl::io::read_raw_file()!";
    }
    delete[] buffer;
    #undef INDEX

    return lattice;
}